

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderApiTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::sampler_parameterfv(NegativeTestContext *ctx)

{
  NegativeTestContext *pNVar1;
  allocator<char> local_71;
  string local_70;
  allocator<char> local_39;
  string local_38;
  GLuint local_18;
  GLfloat local_14;
  GLuint sampler;
  float params;
  NegativeTestContext *ctx_local;
  
  local_18 = 0;
  _sampler = ctx;
  glu::CallLogWrapper::glGenSamplers(&ctx->super_CallLogWrapper,1,&local_18);
  pNVar1 = _sampler;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,
             "GL_INVALID_OPERATION is generated if sampler is not the name of a sampler object previously returned from a call to ctx.glGenSamplers."
             ,&local_39);
  NegativeTestContext::beginSection(pNVar1,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  local_14 = -1000.0;
  glu::CallLogWrapper::glSamplerParameterfv
            (&_sampler->super_CallLogWrapper,0xffffffff,0x2802,&local_14);
  NegativeTestContext::expectError(_sampler,0x502);
  NegativeTestContext::endSection(_sampler);
  pNVar1 = _sampler;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,
             "GL_INVALID_ENUM is generated if params should have a defined constant value (based on the value of pname) and does not."
             ,&local_71);
  NegativeTestContext::beginSection(pNVar1,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  local_14 = -1.0;
  glu::CallLogWrapper::glSamplerParameterfv
            (&_sampler->super_CallLogWrapper,local_18,0x2802,&local_14);
  NegativeTestContext::expectError(_sampler,0x500);
  NegativeTestContext::endSection(_sampler);
  glu::CallLogWrapper::glDeleteSamplers(&_sampler->super_CallLogWrapper,1,&local_18);
  return;
}

Assistant:

void sampler_parameterfv (NegativeTestContext& ctx)
{
	float			params;
	GLuint			sampler = 0;
	ctx.glGenSamplers	(1, &sampler);

	ctx.beginSection("GL_INVALID_OPERATION is generated if sampler is not the name of a sampler object previously returned from a call to ctx.glGenSamplers.");
	params = -1000.0f;
	ctx.glSamplerParameterfv	(-1, GL_TEXTURE_WRAP_S, &params);
	ctx.expectError			(GL_INVALID_OPERATION);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_ENUM is generated if params should have a defined constant value (based on the value of pname) and does not.");
	params = -1.0f;
	ctx.glSamplerParameterfv	(sampler, GL_TEXTURE_WRAP_S, &params);
	ctx.expectError			(GL_INVALID_ENUM);
	ctx.endSection();

	ctx.glDeleteSamplers(1, &sampler);
}